

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.cpp
# Opt level: O0

int mbedtls_asn1_write_raw_buffer(uchar **p,uchar *start,uchar *buf,size_t size)

{
  ulong in_RCX;
  void *in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  size_t len;
  undefined4 local_4;
  
  if ((*in_RDI < in_RSI) || (*in_RDI - in_RSI < in_RCX)) {
    local_4 = -0x6c;
  }
  else {
    *in_RDI = *in_RDI - in_RCX;
    memcpy((void *)*in_RDI,in_RDX,in_RCX);
    local_4 = (int)in_RCX;
  }
  return local_4;
}

Assistant:

int mbedtls_asn1_write_raw_buffer(unsigned char **p, const unsigned char *start,
                                  const unsigned char *buf, size_t size)
{
    size_t len = 0;

    if (*p < start || (size_t) (*p - start) < size) {
        return MBEDTLS_ERR_ASN1_BUF_TOO_SMALL;
    }

    len = size;
    (*p) -= len;
    memcpy(*p, buf, len);

    return (int) len;
}